

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O1

int resolve_scope_var(JSContext *ctx,JSFunctionDef *s,JSAtom var_name,int scope_level,int op,
                     DynBuf *bc,uint8_t *bc_buf,LabelSlot *ls,int pos_next)

{
  undefined1 *puVar1;
  byte bVar2;
  uint uVar3;
  JSVarDef *pJVar4;
  JSClosureVar *pJVar5;
  JSAtomStruct *pJVar6;
  JSClosureVar JVar7;
  JSFunctionDef *pJVar8;
  uint8_t uVar9;
  uint uVar10;
  int iVar11;
  uint uVar12;
  JSVarKindEnum var_kind;
  int iVar13;
  undefined8 in_RAX;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  JSRuntime *pJVar14;
  ulong uVar15;
  ulong extraout_RDX;
  ulong extraout_RDX_00;
  ulong extraout_RDX_01;
  ulong extraout_RDX_02;
  ulong extraout_RDX_03;
  ulong extraout_RDX_04;
  ulong extraout_RDX_05;
  ulong extraout_RDX_06;
  ulong extraout_RDX_07;
  ulong extraout_RDX_08;
  ulong extraout_RDX_09;
  ulong extraout_RDX_10;
  ulong extraout_RDX_11;
  size_t len;
  ulong uVar16;
  long lVar17;
  JSContext *pJVar18;
  JSContext *pJVar19;
  LabelSlot *ls_00;
  JSAtom JVar20;
  uint uVar21;
  undefined2 uVar22;
  ulong uVar23;
  JSFunctionDef *pJVar24;
  JSFunctionDef *s_00;
  bool bVar25;
  int in_stack_ffffffffffffff78;
  int in_stack_ffffffffffffff80;
  int local_7c;
  ulong local_78;
  JSContext *local_70;
  undefined4 local_68;
  int label_done;
  JSContext *local_60;
  ulong local_58;
  ulong local_50;
  int local_44;
  JSFunctionDef *local_40;
  ulong local_38;
  
  uVar15 = (ulong)var_name;
  local_58 = (ulong)(uint)op;
  uVar16 = (ulong)var_name;
  label_done = -1;
  local_68 = (undefined4)CONCAT71((int7)((ulong)in_RAX >> 8),1);
  if ((2 < var_name - 0x71) && (var_name != 8)) {
    local_68 = 0;
  }
  local_44 = pos_next;
  uVar12 = s->scopes[(uint)scope_level].first;
  uVar23 = 0xffffffff;
  local_78 = uVar16;
  local_70 = ctx;
  local_60 = (JSContext *)bc;
  if (-1 < (int)uVar12) {
    do {
      pJVar18 = local_60;
      pJVar4 = s->vars;
      if (pJVar4[uVar12].var_name == (JSAtom)uVar16) {
        op = (int)local_58;
        if ((op != 0xb9) && (op != 0xb7)) {
          uVar23 = (ulong)uVar12;
          goto LAB_00160545;
        }
        uVar23 = (ulong)uVar12;
        if ((pJVar4[uVar12].field_0xc & 1) == 0) goto LAB_00160545;
        goto LAB_00161183;
      }
      if (pJVar4[uVar12].var_name == 0x54 && (char)local_68 == '\0') {
        dbuf_putc((DynBuf *)local_60,'X');
        local_7c = CONCAT22(local_7c._2_2_,(short)uVar12);
        dbuf_put((DynBuf *)pJVar18,(uint8_t *)&local_7c,2);
        var_object_test(local_70,s,(JSAtom)local_78,(int)local_58,(DynBuf *)pJVar18,&label_done,1);
        uVar15 = extraout_RDX;
        uVar16 = local_78;
      }
      uVar12 = pJVar4[uVar12].scope_next;
    } while (-1 < (int)uVar12);
    op = (int)local_58;
    uVar23 = 0xffffffff;
  }
LAB_00160545:
  pJVar18 = local_60;
  if ((int)uVar23 < 0) {
    uVar23 = 0xffffffff;
    if (uVar12 != 0xfffffffe) {
      uVar10 = find_var((JSContext *)s,(JSFunctionDef *)(uVar16 & 0xffffffff),(JSAtom)uVar15);
      uVar23 = (ulong)uVar10;
      uVar15 = extraout_RDX_00;
      uVar16 = local_78;
    }
    if ((char)local_68 == '\x01' && (int)uVar23 < 0) {
      uVar10 = resolve_pseudo_var(local_70,s,(JSAtom)uVar16);
      uVar23 = (ulong)uVar10;
      uVar15 = extraout_RDX_01;
      uVar16 = local_78;
    }
    if ((((int)uVar16 == 0x4d && (int)uVar23 < 0) && (s->has_arguments_binding != 0)) &&
       (uVar23 = (ulong)(uint)s->arguments_var_idx, s->arguments_var_idx < 0)) {
      uVar10 = add_var(local_70,s,0x4d);
      uVar23 = (ulong)uVar10;
      uVar15 = extraout_RDX_02;
      uVar16 = local_78;
      if (-1 < (int)uVar10) {
        s->arguments_var_idx = uVar10;
      }
    }
    if ((((int)uVar23 < 0) && (s->is_func_expr != 0)) && (s->func_name == (JSAtom)uVar16)) {
      uVar10 = add_func_var(local_70,s,(JSAtom)uVar16);
      uVar23 = (ulong)uVar10;
      uVar15 = extraout_RDX_11;
      uVar16 = local_78;
    }
  }
  pJVar19 = local_70;
  uVar10 = (uint)uVar23;
  if (-1 < (int)uVar10) {
    uVar22 = (undefined2)uVar23;
    switch(op + -0xb5) {
    case 2:
    case 4:
      if (((uVar10 >> 0x1d & 1) != 0) || ((s->vars[uVar23].field_0xc & 1) == 0)) {
        switch(op + -0xb5) {
        case 0:
        case 1:
        case 2:
        case 6:
          goto switchD_0016060e_caseD_0;
        case 3:
          goto switchD_0016060e_caseD_3;
        case 4:
          goto switchD_00160647_caseD_4;
        case 5:
          goto switchD_0016060e_caseD_5;
        default:
          goto switchD_0016060e_default;
        }
      }
LAB_00161183:
      dbuf_putc((DynBuf *)pJVar18,'0');
      local_7c = (int)local_78;
      if (0xd1 < local_7c) {
        pJVar14 = local_70->rt;
LAB_001611a6:
        local_7c = (int)local_78;
        (pJVar14->atom_array[local_78 & 0xffffffff]->header).ref_count =
             (pJVar14->atom_array[local_78 & 0xffffffff]->header).ref_count + 1;
      }
LAB_001611b2:
      dbuf_put((DynBuf *)pJVar18,(uint8_t *)&local_7c,4);
      uVar9 = '\0';
      goto LAB_001611cb;
    case 3:
      goto switchD_0016060e_caseD_3;
    case 5:
switchD_0016060e_caseD_5:
      dbuf_putc((DynBuf *)pJVar18,'\x06');
      uVar16 = local_78;
    case 0:
    case 1:
    case 6:
switchD_0016060e_caseD_0:
      if ((uVar10 >> 0x1d & 1) == 0) {
        if ((op == 0xbb) || (op == 0xb7)) {
          bVar25 = (s->vars[uVar23].field_0xc & 2) == 0;
          uVar9 = 'c';
          if (bVar25) {
            uVar9 = 'Y';
          }
          if ((!bVar25 && op == 0xbb) && (uVar9 = 'Y', (int)uVar16 == 8)) {
            uVar9 = 'd';
          }
        }
        else {
          uVar9 = 'b';
          if ((s->vars[uVar23].field_0xc & 2) == 0) {
            uVar9 = 'X';
          }
        }
      }
      else {
        uVar9 = ((op - 0xb7U & 0xfffffffb) == 0) + '[';
      }
      dbuf_putc((DynBuf *)pJVar18,uVar9);
      local_7c = CONCAT22(local_7c._2_2_,uVar22);
      break;
    default:
      goto switchD_0016060e_default;
    }
    goto LAB_00160bf5;
  }
  if ((uVar12 != 0xfffffffe) && (-1 < s->var_object_idx && (char)local_68 == '\0')) {
    dbuf_putc((DynBuf *)pJVar18,'X');
    local_7c = CONCAT22(local_7c._2_2_,(short)s->var_object_idx);
    dbuf_put((DynBuf *)pJVar18,(uint8_t *)&local_7c,2);
    var_object_test(local_70,s,(JSAtom)local_78,op,(DynBuf *)pJVar18,&label_done,0);
    uVar15 = extraout_RDX_03;
    uVar16 = local_78;
  }
  if (-1 < s->arg_var_object_idx && (char)local_68 == '\0') {
    dbuf_putc((DynBuf *)pJVar18,'X');
    local_7c = CONCAT22(local_7c._2_2_,(short)s->arg_var_object_idx);
    dbuf_put((DynBuf *)pJVar18,(uint8_t *)&local_7c,2);
    var_object_test(local_70,s,(JSAtom)local_78,op,(DynBuf *)pJVar18,&label_done,0);
    uVar15 = extraout_RDX_04;
    uVar16 = local_78;
  }
  pJVar8 = s->parent;
  s_00 = s;
  pJVar24 = s;
  local_50 = uVar23;
  if (s->parent != (JSFunctionDef *)0x0) {
    do {
      s_00 = pJVar8;
      uVar12 = s_00->scopes[pJVar24->parent_scope_level].first;
      while( true ) {
        uVar23 = (ulong)uVar12;
        if ((int)uVar12 < 0) break;
        pJVar4 = s_00->vars;
        JVar20 = pJVar4[uVar23].var_name;
        if (JVar20 == (JSAtom)uVar16) {
          local_50 = uVar23;
          if ((((int)local_58 == 0xb9) || ((int)local_58 == 0xb7)) &&
             (pJVar18 = local_60, (pJVar4[uVar23].field_0xc & 1) != 0)) goto LAB_00161183;
          break;
        }
        if (JVar20 == 0x54 && (char)local_68 == '\0') {
          pJVar4[uVar23].field_0xc = pJVar4[uVar23].field_0xc | 4;
          iVar11 = get_closure_var2(local_70,s,s_00,1,0,uVar12,JVar20,0,0,JS_VAR_NORMAL);
          pJVar18 = local_60;
          uVar15 = extraout_RDX_05;
          uVar16 = local_78;
          if (-1 < iVar11) {
            dbuf_putc((DynBuf *)local_60,'^');
            local_7c = CONCAT22(local_7c._2_2_,(short)iVar11);
            dbuf_put((DynBuf *)pJVar18,(uint8_t *)&local_7c,2);
            var_object_test(local_70,s,(JSAtom)local_78,(int)local_58,(DynBuf *)pJVar18,&label_done,
                            1);
            uVar15 = extraout_RDX_06;
            uVar16 = local_78;
          }
        }
        uVar12 = pJVar4[uVar23].scope_next;
      }
      if (-1 < (int)local_50) break;
      if (uVar12 != 0xfffffffe) {
        iVar11 = find_var((JSContext *)s_00,(JSFunctionDef *)(uVar16 & 0xffffffff),(JSAtom)uVar15);
        local_50 = CONCAT44(extraout_var,iVar11);
        uVar15 = extraout_RDX_07;
        uVar16 = local_78;
        if (-1 < iVar11) break;
      }
      if ((char)local_68 != '\0') {
        iVar11 = resolve_pseudo_var(local_70,s_00,(JSAtom)uVar16);
        local_50 = CONCAT44(extraout_var_00,iVar11);
        uVar15 = extraout_RDX_08;
        uVar16 = local_78;
        if (-1 < iVar11) break;
      }
      pJVar18 = local_70;
      JVar20 = (JSAtom)uVar16;
      if ((JVar20 == 0x4d) && (s_00->has_arguments_binding != 0)) {
        local_50 = (ulong)(uint)s_00->arguments_var_idx;
        if (s_00->arguments_var_idx < 0) {
          iVar11 = add_var(local_70,s_00,0x4d);
          local_50 = CONCAT44(extraout_var_02,iVar11);
          uVar16 = local_78;
          if (-1 < iVar11) {
            s_00->arguments_var_idx = iVar11;
          }
        }
        break;
      }
      if ((s_00->is_func_expr != 0) && (s_00->func_name == JVar20)) {
        iVar11 = add_func_var(local_70,s_00,JVar20);
        local_50 = CONCAT44(extraout_var_01,iVar11);
        uVar16 = local_78;
        break;
      }
      uVar10 = 0xfffffffe;
      if (uVar12 != 0xfffffffe) {
        lVar17 = (long)s_00->var_object_idx;
        uVar10 = uVar12;
        if (-1 < lVar17 && (char)local_68 == '\0') {
          pJVar4 = s_00->vars;
          puVar1 = &pJVar4[lVar17].field_0xc;
          *(uint *)puVar1 = *(uint *)puVar1 | 4;
          uVar10 = get_closure_var2(local_70,s,s_00,1,0,s_00->var_object_idx,pJVar4[lVar17].var_name
                                    ,0,0,JS_VAR_NORMAL);
          pJVar19 = local_60;
          dbuf_putc((DynBuf *)local_60,'^');
          local_7c = CONCAT22(local_7c._2_2_,(short)uVar10);
          dbuf_put((DynBuf *)pJVar19,(uint8_t *)&local_7c,2);
          var_object_test(pJVar18,s,(JSAtom)local_78,(int)local_58,(DynBuf *)pJVar19,&label_done,0);
          uVar15 = extraout_RDX_09;
          uVar16 = local_78;
        }
      }
      uVar12 = uVar10;
      pJVar18 = local_70;
      lVar17 = (long)s_00->arg_var_object_idx;
      if (-1 < lVar17 && (char)local_68 == '\0') {
        pJVar4 = s_00->vars;
        puVar1 = &pJVar4[lVar17].field_0xc;
        *(uint *)puVar1 = *(uint *)puVar1 | 4;
        uVar12 = get_closure_var2(local_70,s,s_00,1,0,s_00->arg_var_object_idx,
                                  pJVar4[lVar17].var_name,0,0,JS_VAR_NORMAL);
        pJVar19 = local_60;
        dbuf_putc((DynBuf *)local_60,'^');
        local_7c = CONCAT22(local_7c._2_2_,(short)uVar12);
        dbuf_put((DynBuf *)pJVar19,(uint8_t *)&local_7c,2);
        var_object_test(pJVar18,s,(JSAtom)local_78,(int)local_58,(DynBuf *)pJVar19,&label_done,0);
        uVar15 = extraout_RDX_10;
        uVar16 = local_78;
      }
      if ((s_00->is_eval != 0) ||
         (pJVar8 = s_00->parent, pJVar24 = s_00, s_00->parent == (JSFunctionDef *)0x0)) break;
    } while( true );
  }
  if (s_00 == (JSFunctionDef *)0x0) {
    s_00 = s;
  }
  iVar11 = (int)local_58;
  if ((-1 < (int)local_50) || (s_00->is_eval == 0)) {
LAB_00160c48:
    pJVar19 = local_70;
    uVar12 = (uint)local_50;
    if (-1 < (int)uVar12) {
      bVar25 = (uVar12 >> 0x1d & 1) != 0;
      if (bVar25) {
        uVar12 = uVar12 + 0xe0000000;
        puVar1 = &s_00->args[uVar12].field_0xc;
        *(uint *)puVar1 = *(uint *)puVar1 | 4;
        var_kind = JS_VAR_NORMAL;
        uVar21 = 0;
        uVar10 = 0;
      }
      else {
        puVar1 = &s_00->vars[local_50 & 0xffffffff].field_0xc;
        *(uint *)puVar1 = *(uint *)puVar1 | 4;
        uVar3 = *(uint *)&s_00->vars[local_50 & 0xffffffff].field_0xc;
        uVar10 = uVar3 & 1;
        uVar21 = uVar3 >> 1 & 1;
        var_kind = uVar3 >> 3 & (JS_VAR_PRIVATE_SETTER|JS_VAR_PRIVATE_GETTER);
        iVar11 = (int)local_58;
      }
      uVar12 = get_closure_var2(local_70,s,s_00,1,(uint)bVar25,uVar12,(JSAtom)uVar16,uVar10,uVar21,
                                var_kind);
      uVar16 = local_78;
      if (-1 < (int)uVar12) goto LAB_00160e9e;
    }
    pJVar18 = local_60;
    switch(iVar11) {
    case 0xb5:
    case 0xb6:
    case 0xb7:
      uVar9 = (char)iVar11 + 0x82;
      break;
    case 0xb8:
      uVar9 = 0x99;
      break;
    case 0xb9:
      if ((label_done == -1) && (bc_buf[(long)ls->pos + 1] == '=')) {
        bVar2 = bc_buf[ls->pos];
        if (((bVar2 < 0x1e) && ((0x22400000U >> (bVar2 & 0x1f) & 1) != 0)) || (bVar2 == 0xb1)) {
          local_44 = optimize_scope_make_global_ref
                               (pJVar19,s,(DynBuf *)local_60,bc_buf,ls,pos_next,(JSAtom)uVar16);
          goto switchD_0016060e_default;
        }
      }
      uVar9 = '{';
      break;
    case 0xba:
      dbuf_putc((DynBuf *)local_60,'\x06');
      uVar9 = '8';
      break;
    case 0xbb:
      uVar9 = ':';
      break;
    default:
      goto switchD_0016060e_default;
    }
    dbuf_putc((DynBuf *)pJVar18,uVar9);
    local_7c = (int)local_78;
    if (0xd1 < local_7c) {
      pJVar6 = pJVar19->rt->atom_array[local_78 & 0xffffffff];
      (pJVar6->header).ref_count = (pJVar6->header).ref_count + 1;
    }
LAB_001610c6:
    len = 4;
    goto LAB_001610ce;
  }
  pJVar19 = local_70;
  if (s_00->closure_var_count < 1) {
    iVar13 = 0;
  }
  else {
    lVar17 = 0;
    local_40 = s;
    do {
      pJVar5 = s_00->closure_var;
      uVar10 = pJVar5[lVar17].var_name;
      uVar21 = (uint)lVar17;
      if (uVar10 == (uint)uVar16) {
        if (s_00 == s) {
          iVar13 = 0xd;
          uVar12 = uVar21;
        }
        else {
          bVar2 = *(byte *)(pJVar5 + lVar17);
          uVar12 = get_closure_var2(pJVar19,s,s_00,0,bVar2 >> 1 & 1,uVar21,uVar10,bVar2 >> 2 & 1,
                                    bVar2 >> 3 & 1,(uint)(bVar2 >> 4));
          iVar13 = 0xd;
          uVar16 = local_78;
        }
      }
      else {
        if ((uVar10 & 0xfffffffe) == 0x52) {
          if ((char)local_68 != '\0') {
LAB_00160da8:
            iVar13 = 0;
            goto LAB_00160e2b;
          }
        }
        else if (uVar10 != 0x54 || (char)local_68 != '\0') goto LAB_00160da8;
        uVar12 = uVar21;
        if (s_00 != s) {
          uVar12 = get_closure_var2(pJVar19,s,s_00,0,*(uint *)(pJVar5 + lVar17) >> 1 & 1,uVar21,
                                    uVar10,0,0,JS_VAR_NORMAL);
        }
        pJVar18 = local_60;
        local_38 = (ulong)(uVar10 == 0x54);
        dbuf_putc((DynBuf *)local_60,'^');
        local_7c = CONCAT22(local_7c._2_2_,(short)uVar12);
        dbuf_put((DynBuf *)pJVar18,(uint8_t *)&local_7c,2);
        uVar16 = local_78;
        var_object_test(local_70,s,(JSAtom)local_78,(int)local_58,(DynBuf *)pJVar18,&label_done,
                        (BOOL)local_38);
        iVar13 = 0;
        pJVar19 = local_70;
        s = local_40;
      }
LAB_00160e2b:
      if (uVar10 == (uint)uVar16) goto LAB_00160e45;
      lVar17 = lVar17 + 1;
    } while (lVar17 < s_00->closure_var_count);
    iVar13 = 0;
LAB_00160e45:
    iVar11 = (int)local_58;
  }
  if (iVar13 != 0xd) {
    if (iVar13 != 0) {
      return local_44;
    }
    goto LAB_00160c48;
  }
LAB_00160e9e:
  pJVar18 = local_60;
  iVar13 = (int)uVar16;
  uVar22 = (undefined2)uVar12;
  switch(iVar11 + -0xb5) {
  case 2:
  case 4:
    JVar7 = s->closure_var[(int)uVar12];
    if (((ulong)JVar7 & 4) != 0) {
      dbuf_putc((DynBuf *)local_60,'0');
      local_7c = (int)local_78;
      if (0xd1 < local_7c) {
        pJVar14 = pJVar19->rt;
        goto LAB_001611a6;
      }
      goto LAB_001611b2;
    }
    switch(iVar11 + -0xb5) {
    case 0:
    case 1:
      goto switchD_00160ebc_caseD_0;
    case 2:
    case 6:
      goto switchD_00160ebc_caseD_6;
    case 3:
      goto switchD_0016060e_caseD_3;
    case 4:
      if (((ulong)JVar7 & 0xf0) == 0x40) {
        dbuf_putc((DynBuf *)local_60,'\v');
        dbuf_putc((DynBuf *)pJVar18,'^');
        local_7c = CONCAT22(local_7c._2_2_,uVar22);
        dbuf_put((DynBuf *)pJVar18,(uint8_t *)&local_7c,2);
        dbuf_putc((DynBuf *)pJVar18,'L');
        iVar11 = (int)local_78;
        if (0xd1 < iVar11) {
          uVar16 = local_78 & 0xffffffff;
          pJVar6 = pJVar19->rt->atom_array[uVar16];
          (pJVar6->header).ref_count = (pJVar6->header).ref_count + 1;
          local_7c = iVar11;
          dbuf_put((DynBuf *)pJVar18,(uint8_t *)&local_7c,4);
          dbuf_putc((DynBuf *)pJVar18,'\x04');
          pJVar14 = pJVar19->rt;
          goto LAB_0016134e;
        }
        goto LAB_0016135a;
      }
      if ((label_done == -1) && (bc_buf[(long)ls->pos + 1] == '=')) {
        bVar2 = bc_buf[ls->pos];
        if (((bVar2 < 0x1e) && ((0x22400000U >> (bVar2 & 0x1f) & 1) != 0)) || (bVar2 == 0xb1)) {
          ls_00 = (LabelSlot *)0x65;
          if (((ulong)JVar7 & 8) == 0) {
            ls_00 = (LabelSlot *)0x5e;
          }
          goto LAB_00161472;
        }
      }
      dbuf_putc((DynBuf *)local_60,'z');
      pJVar18 = local_60;
      local_7c = (int)local_78;
      if (0xd1 < local_7c) {
        pJVar6 = pJVar19->rt->atom_array[local_78 & 0xffffffff];
        (pJVar6->header).ref_count = (pJVar6->header).ref_count + 1;
      }
      dbuf_put((DynBuf *)local_60,(uint8_t *)&local_7c,4);
      local_7c = CONCAT22(local_7c._2_2_,uVar22);
      goto LAB_001612a9;
    case 5:
      goto switchD_00160ebc_caseD_5;
    default:
      break;
    }
  case 3:
switchD_0016060e_caseD_3:
    uVar9 = '\t';
LAB_001611cb:
    dbuf_putc((DynBuf *)pJVar18,uVar9);
    break;
  case 5:
switchD_00160ebc_caseD_5:
    dbuf_putc((DynBuf *)local_60,'\x06');
    iVar13 = (int)local_78;
    if ((iVar11 == 0xbb) || (iVar11 == 0xb7)) goto switchD_00160ebc_caseD_6;
  case 0:
  case 1:
switchD_00160ebc_caseD_0:
    uVar9 = 'e';
    if (((ulong)s->closure_var[(int)uVar12] & 8) == 0) {
      uVar9 = '^';
    }
LAB_0016107c:
    dbuf_putc((DynBuf *)pJVar18,uVar9);
    local_7c = CONCAT22(local_7c._2_2_,uVar22);
LAB_00160bf5:
    len = 2;
LAB_001610ce:
    dbuf_put((DynBuf *)pJVar18,(uint8_t *)&local_7c,len);
    break;
  case 6:
switchD_00160ebc_caseD_6:
    bVar25 = ((ulong)s->closure_var[(int)uVar12] & 8) == 0;
    uVar9 = 'f';
    if (bVar25) {
      uVar9 = '_';
    }
    if (!bVar25 && iVar11 == 0xbb) {
      uVar9 = (iVar13 == 8) * '\b' + '_';
    }
    goto LAB_0016107c;
  default:
    break;
  }
switchD_0016060e_default:
  iVar11 = label_done;
  lVar17 = (long)label_done;
  if (-1 < lVar17) {
    dbuf_putc((DynBuf *)pJVar18,0xb4);
    local_7c = iVar11;
    dbuf_put((DynBuf *)pJVar18,(uint8_t *)&local_7c,4);
    s->label_slots[lVar17].pos2 = *(int *)&(pJVar18->header).link.prev;
  }
  return local_44;
switchD_00160647_caseD_4:
  if (((uVar10 >> 0x1d & 1) == 0) && ((*(uint *)&s->vars[uVar23].field_0xc & 0x78) == 0x20)) {
    dbuf_putc((DynBuf *)pJVar18,'\v');
    dbuf_putc((DynBuf *)pJVar18,'X');
    local_7c = CONCAT22(local_7c._2_2_,uVar22);
    dbuf_put((DynBuf *)pJVar18,(uint8_t *)&local_7c,2);
    dbuf_putc((DynBuf *)pJVar18,'L');
    pJVar19 = local_70;
    iVar11 = (int)local_78;
    if (iVar11 < 0xd2) {
LAB_0016135a:
      local_7c = iVar11;
      dbuf_put((DynBuf *)pJVar18,(uint8_t *)&local_7c,4);
      dbuf_putc((DynBuf *)pJVar18,'\x04');
      local_7c = iVar11;
    }
    else {
      uVar16 = local_78 & 0xffffffff;
      pJVar6 = local_70->rt->atom_array[uVar16];
      (pJVar6->header).ref_count = (pJVar6->header).ref_count + 1;
      local_7c = iVar11;
      dbuf_put((DynBuf *)pJVar18,(uint8_t *)&local_7c,4);
      dbuf_putc((DynBuf *)pJVar18,'\x04');
      pJVar14 = pJVar19->rt;
LAB_0016134e:
      (pJVar14->atom_array[uVar16]->header).ref_count =
           (pJVar14->atom_array[uVar16]->header).ref_count + 1;
      local_7c = iVar11;
    }
    goto LAB_001610c6;
  }
  if ((label_done == -1) && (bc_buf[(long)ls->pos + 1] == '=')) {
    bVar2 = bc_buf[ls->pos];
    if (((0x1d < bVar2) || ((0x22400000U >> (bVar2 & 0x1f) & 1) == 0)) && (bVar2 != 0xb1))
    goto LAB_00161221;
    if ((uVar10 >> 0x1d & 1) == 0) {
      ls_00 = (LabelSlot *)0x62;
      if ((s->vars[uVar23].field_0xc & 2) == 0) {
        ls_00 = (LabelSlot *)0x58;
      }
    }
    else {
      uVar23 = (ulong)(uVar10 + 0xe0000000);
      ls_00 = (LabelSlot *)0x5b;
    }
    uVar12 = (uint)uVar23;
LAB_00161472:
    local_44 = optimize_scope_make_ref
                         (pJVar18,(JSFunctionDef *)bc_buf,(DynBuf *)ls,
                          (uint8_t *)(ulong)(uint)pos_next,ls_00,uVar12,in_stack_ffffffffffffff78,
                          in_stack_ffffffffffffff80);
    goto switchD_0016060e_default;
  }
LAB_00161221:
  if ((uVar10 >> 0x1d & 1) == 0) {
    uVar9 = 'x';
  }
  else {
    uVar9 = 'y';
  }
  dbuf_putc((DynBuf *)pJVar18,uVar9);
  pJVar18 = local_60;
  local_7c = (int)local_78;
  if (0xd1 < local_7c) {
    pJVar6 = pJVar19->rt->atom_array[local_78 & 0xffffffff];
    (pJVar6->header).ref_count = (pJVar6->header).ref_count + 1;
  }
  dbuf_put((DynBuf *)local_60,(uint8_t *)&local_7c,4);
  local_7c = CONCAT22(local_7c._2_2_,uVar22);
LAB_001612a9:
  len = 2;
  goto LAB_001610ce;
}

Assistant:

static int resolve_scope_var(JSContext *ctx, JSFunctionDef *s,
                             JSAtom var_name, int scope_level, int op,
                             DynBuf *bc, uint8_t *bc_buf,
                             LabelSlot *ls, int pos_next)
{
    int idx, var_idx, is_put;
    int label_done;
    JSFunctionDef *fd;
    JSVarDef *vd;
    BOOL is_pseudo_var, is_arg_scope;

    label_done = -1;

    /* XXX: could be simpler to use a specific function to
       resolve the pseudo variables */
    is_pseudo_var = (var_name == JS_ATOM_home_object ||
                     var_name == JS_ATOM_this_active_func ||
                     var_name == JS_ATOM_new_target ||
                     var_name == JS_ATOM_this);

    /* resolve local scoped variables */
    var_idx = -1;
    for (idx = s->scopes[scope_level].first; idx >= 0;) {
        vd = &s->vars[idx];
        if (vd->var_name == var_name) {
            if (op == OP_scope_put_var || op == OP_scope_make_ref) {
                if (vd->is_const) {
                    dbuf_putc(bc, OP_throw_error);
                    dbuf_put_u32(bc, JS_DupAtom(ctx, var_name));
                    dbuf_putc(bc, JS_THROW_VAR_RO);
                    goto done;
                }
            }
            var_idx = idx;
            break;
        } else
        if (vd->var_name == JS_ATOM__with_ && !is_pseudo_var) {
            dbuf_putc(bc, OP_get_loc);
            dbuf_put_u16(bc, idx);
            var_object_test(ctx, s, var_name, op, bc, &label_done, 1);
        }
        idx = vd->scope_next;
    }
    is_arg_scope = (idx == ARG_SCOPE_END);
    if (var_idx < 0) {
        /* argument scope: variables are not visible but pseudo
           variables are visible */
        if (!is_arg_scope) {
            var_idx = find_var(ctx, s, var_name);
        }

        if (var_idx < 0 && is_pseudo_var)
            var_idx = resolve_pseudo_var(ctx, s, var_name);

        if (var_idx < 0 && var_name == JS_ATOM_arguments &&
            s->has_arguments_binding) {
            /* 'arguments' pseudo variable */
            var_idx = add_arguments_var(ctx, s);
        }
        if (var_idx < 0 && s->is_func_expr && var_name == s->func_name) {
            /* add a new variable with the function name */
            var_idx = add_func_var(ctx, s, var_name);
        }
    }
    if (var_idx >= 0) {
        if ((op == OP_scope_put_var || op == OP_scope_make_ref) &&
            !(var_idx & ARGUMENT_VAR_OFFSET) &&
            s->vars[var_idx].is_const) {
            /* only happens when assigning a function expression name
               in strict mode */
            dbuf_putc(bc, OP_throw_error);
            dbuf_put_u32(bc, JS_DupAtom(ctx, var_name));
            dbuf_putc(bc, JS_THROW_VAR_RO);
            goto done;
        }
        /* OP_scope_put_var_init is only used to initialize a
           lexical variable, so it is never used in a with or var object. It
           can be used with a closure (module global variable case). */
        switch (op) {
        case OP_scope_make_ref:
            if (!(var_idx & ARGUMENT_VAR_OFFSET) &&
                s->vars[var_idx].var_kind == JS_VAR_FUNCTION_NAME) {
                /* Create a dummy object reference for the func_var */
                dbuf_putc(bc, OP_object);
                dbuf_putc(bc, OP_get_loc);
                dbuf_put_u16(bc, var_idx);
                dbuf_putc(bc, OP_define_field);
                dbuf_put_u32(bc, JS_DupAtom(ctx, var_name));
                dbuf_putc(bc, OP_push_atom_value);
                dbuf_put_u32(bc, JS_DupAtom(ctx, var_name));
            } else
            if (label_done == -1 && can_opt_put_ref_value(bc_buf, ls->pos)) {
                int get_op;
                if (var_idx & ARGUMENT_VAR_OFFSET) {
                    get_op = OP_get_arg;
                    var_idx -= ARGUMENT_VAR_OFFSET;
                } else {
                    if (s->vars[var_idx].is_lexical)
                        get_op = OP_get_loc_check;
                    else
                        get_op = OP_get_loc;
                }
                pos_next = optimize_scope_make_ref(ctx, s, bc, bc_buf, ls,
                                                   pos_next, get_op, var_idx);
            } else {
                /* Create a dummy object with a named slot that is
                   a reference to the local variable */
                if (var_idx & ARGUMENT_VAR_OFFSET) {
                    dbuf_putc(bc, OP_make_arg_ref);
                    dbuf_put_u32(bc, JS_DupAtom(ctx, var_name));
                    dbuf_put_u16(bc, var_idx - ARGUMENT_VAR_OFFSET);
                } else {
                    dbuf_putc(bc, OP_make_loc_ref);
                    dbuf_put_u32(bc, JS_DupAtom(ctx, var_name));
                    dbuf_put_u16(bc, var_idx);
                }
            }
            break;
        case OP_scope_get_ref:
            dbuf_putc(bc, OP_undefined);
            /* fall thru */
        case OP_scope_get_var_undef:
        case OP_scope_get_var:
        case OP_scope_put_var:
        case OP_scope_put_var_init:
            is_put = (op == OP_scope_put_var || op == OP_scope_put_var_init);
            if (var_idx & ARGUMENT_VAR_OFFSET) {
                dbuf_putc(bc, OP_get_arg + is_put);
                dbuf_put_u16(bc, var_idx - ARGUMENT_VAR_OFFSET);
            } else {
                if (is_put) {
                    if (s->vars[var_idx].is_lexical) {
                        if (op == OP_scope_put_var_init) {
                            /* 'this' can only be initialized once */
                            if (var_name == JS_ATOM_this)
                                dbuf_putc(bc, OP_put_loc_check_init);
                            else
                                dbuf_putc(bc, OP_put_loc);
                        } else {
                            dbuf_putc(bc, OP_put_loc_check);
                        }
                    } else {
                        dbuf_putc(bc, OP_put_loc);
                    }
                } else {
                    if (s->vars[var_idx].is_lexical) {
                        dbuf_putc(bc, OP_get_loc_check);
                    } else {
                        dbuf_putc(bc, OP_get_loc);
                    }
                }
                dbuf_put_u16(bc, var_idx);
            }
            break;
        case OP_scope_delete_var:
            dbuf_putc(bc, OP_push_false);
            break;
        }
        goto done;
    }
    /* check eval object */
    if (!is_arg_scope && s->var_object_idx >= 0 && !is_pseudo_var) {
        dbuf_putc(bc, OP_get_loc);
        dbuf_put_u16(bc, s->var_object_idx);
        var_object_test(ctx, s, var_name, op, bc, &label_done, 0);
    }
    /* check eval object in argument scope */
    if (s->arg_var_object_idx >= 0 && !is_pseudo_var) {
        dbuf_putc(bc, OP_get_loc);
        dbuf_put_u16(bc, s->arg_var_object_idx);
        var_object_test(ctx, s, var_name, op, bc, &label_done, 0);
    }

    /* check parent scopes */
    for (fd = s; fd->parent;) {
        scope_level = fd->parent_scope_level;
        fd = fd->parent;
        for (idx = fd->scopes[scope_level].first; idx >= 0;) {
            vd = &fd->vars[idx];
            if (vd->var_name == var_name) {
                if (op == OP_scope_put_var || op == OP_scope_make_ref) {
                    if (vd->is_const) {
                        dbuf_putc(bc, OP_throw_error);
                        dbuf_put_u32(bc, JS_DupAtom(ctx, var_name));
                        dbuf_putc(bc, JS_THROW_VAR_RO);
                        goto done;
                    }
                }
                var_idx = idx;
                break;
            } else if (vd->var_name == JS_ATOM__with_ && !is_pseudo_var) {
                vd->is_captured = 1;
                idx = get_closure_var(ctx, s, fd, FALSE, idx, vd->var_name, FALSE, FALSE, JS_VAR_NORMAL);
                if (idx >= 0) {
                    dbuf_putc(bc, OP_get_var_ref);
                    dbuf_put_u16(bc, idx);
                    var_object_test(ctx, s, var_name, op, bc, &label_done, 1);
                }
            }
            idx = vd->scope_next;
        }
        is_arg_scope = (idx == ARG_SCOPE_END);
        if (var_idx >= 0)
            break;
        
        if (!is_arg_scope) {
            var_idx = find_var(ctx, fd, var_name);
            if (var_idx >= 0)
                break;
        }
        if (is_pseudo_var) {
            var_idx = resolve_pseudo_var(ctx, fd, var_name);
            if (var_idx >= 0)
                break;
        }
        if (var_name == JS_ATOM_arguments && fd->has_arguments_binding) {
            var_idx = add_arguments_var(ctx, fd);
            break;
        }
        if (fd->is_func_expr && fd->func_name == var_name) {
            /* add a new variable with the function name */
            var_idx = add_func_var(ctx, fd, var_name);
            break;
        }

        /* check eval object */
        if (!is_arg_scope && fd->var_object_idx >= 0 && !is_pseudo_var) {
            vd = &fd->vars[fd->var_object_idx];
            vd->is_captured = 1;
            idx = get_closure_var(ctx, s, fd, FALSE,
                                  fd->var_object_idx, vd->var_name,
                                  FALSE, FALSE, JS_VAR_NORMAL);
            dbuf_putc(bc, OP_get_var_ref);
            dbuf_put_u16(bc, idx);
            var_object_test(ctx, s, var_name, op, bc, &label_done, 0);
        }

        /* check eval object in argument scope */
        if (fd->arg_var_object_idx >= 0 && !is_pseudo_var) {
            vd = &fd->vars[fd->arg_var_object_idx];
            vd->is_captured = 1;
            idx = get_closure_var(ctx, s, fd, FALSE,
                                  fd->arg_var_object_idx, vd->var_name,
                                  FALSE, FALSE, JS_VAR_NORMAL);
            dbuf_putc(bc, OP_get_var_ref);
            dbuf_put_u16(bc, idx);
            var_object_test(ctx, s, var_name, op, bc, &label_done, 0);
        }
        
        if (fd->is_eval)
            break; /* it it necessarily the top level function */
    }

    /* check direct eval scope (in the closure of the eval function
       which is necessarily at the top level) */
    if (!fd)
        fd = s;
    if (var_idx < 0 && fd->is_eval) {
        int idx1;
        for (idx1 = 0; idx1 < fd->closure_var_count; idx1++) {
            JSClosureVar *cv = &fd->closure_var[idx1];
            if (var_name == cv->var_name) {
                if (fd != s) {
                    idx = get_closure_var2(ctx, s, fd,
                                           FALSE,
                                           cv->is_arg, idx1,
                                           cv->var_name, cv->is_const,
                                           cv->is_lexical, cv->var_kind);
                } else {
                    idx = idx1;
                }
                goto has_idx;
            } else if ((cv->var_name == JS_ATOM__var_ ||
                        cv->var_name == JS_ATOM__arg_var_ ||
                        cv->var_name == JS_ATOM__with_) && !is_pseudo_var) {
                int is_with = (cv->var_name == JS_ATOM__with_);
                if (fd != s) {
                    idx = get_closure_var2(ctx, s, fd,
                                           FALSE,
                                           cv->is_arg, idx1,
                                           cv->var_name, FALSE, FALSE,
                                           JS_VAR_NORMAL);
                } else {
                    idx = idx1;
                }
                dbuf_putc(bc, OP_get_var_ref);
                dbuf_put_u16(bc, idx);
                var_object_test(ctx, s, var_name, op, bc, &label_done, is_with);
            }
        }
    }

    if (var_idx >= 0) {
        /* find the corresponding closure variable */
        if (var_idx & ARGUMENT_VAR_OFFSET) {
            fd->args[var_idx - ARGUMENT_VAR_OFFSET].is_captured = 1;
            idx = get_closure_var(ctx, s, fd,
                                  TRUE, var_idx - ARGUMENT_VAR_OFFSET,
                                  var_name, FALSE, FALSE, JS_VAR_NORMAL);
        } else {
            fd->vars[var_idx].is_captured = 1;
            idx = get_closure_var(ctx, s, fd,
                                  FALSE, var_idx,
                                  var_name,
                                  fd->vars[var_idx].is_const,
                                  fd->vars[var_idx].is_lexical,
                                  fd->vars[var_idx].var_kind);
        }
        if (idx >= 0) {
        has_idx:
            if ((op == OP_scope_put_var || op == OP_scope_make_ref) &&
                s->closure_var[idx].is_const) {
                dbuf_putc(bc, OP_throw_error);
                dbuf_put_u32(bc, JS_DupAtom(ctx, var_name));
                dbuf_putc(bc, JS_THROW_VAR_RO);
                goto done;
            }
            switch (op) {
            case OP_scope_make_ref:
                if (s->closure_var[idx].var_kind == JS_VAR_FUNCTION_NAME) {
                    /* Create a dummy object reference for the func_var */
                    dbuf_putc(bc, OP_object);
                    dbuf_putc(bc, OP_get_var_ref);
                    dbuf_put_u16(bc, idx);
                    dbuf_putc(bc, OP_define_field);
                    dbuf_put_u32(bc, JS_DupAtom(ctx, var_name));
                    dbuf_putc(bc, OP_push_atom_value);
                    dbuf_put_u32(bc, JS_DupAtom(ctx, var_name));
                } else
                if (label_done == -1 &&
                    can_opt_put_ref_value(bc_buf, ls->pos)) {
                    int get_op;
                    if (s->closure_var[idx].is_lexical)
                        get_op = OP_get_var_ref_check;
                    else
                        get_op = OP_get_var_ref;
                    pos_next = optimize_scope_make_ref(ctx, s, bc, bc_buf, ls,
                                                       pos_next,
                                                       get_op, idx);
                } else {
                    /* Create a dummy object with a named slot that is
                       a reference to the closure variable */
                    dbuf_putc(bc, OP_make_var_ref_ref);
                    dbuf_put_u32(bc, JS_DupAtom(ctx, var_name));
                    dbuf_put_u16(bc, idx);
                }
                break;
            case OP_scope_get_ref:
                /* XXX: should create a dummy object with a named slot that is
                   a reference to the closure variable */
                dbuf_putc(bc, OP_undefined);
                /* fall thru */
            case OP_scope_get_var_undef:
            case OP_scope_get_var:
            case OP_scope_put_var:
            case OP_scope_put_var_init:
                is_put = (op == OP_scope_put_var ||
                          op == OP_scope_put_var_init);
                if (is_put) {
                    if (s->closure_var[idx].is_lexical) {
                        if (op == OP_scope_put_var_init) {
                            /* 'this' can only be initialized once */
                            if (var_name == JS_ATOM_this)
                                dbuf_putc(bc, OP_put_var_ref_check_init);
                            else
                                dbuf_putc(bc, OP_put_var_ref);
                        } else {
                            dbuf_putc(bc, OP_put_var_ref_check);
                        }
                    } else {
                        dbuf_putc(bc, OP_put_var_ref);
                    }
                } else {
                    if (s->closure_var[idx].is_lexical) {
                        dbuf_putc(bc, OP_get_var_ref_check);
                    } else {
                        dbuf_putc(bc, OP_get_var_ref);
                    }
                }
                dbuf_put_u16(bc, idx);
                break;
            case OP_scope_delete_var:
                dbuf_putc(bc, OP_push_false);
                break;
            }
            goto done;
        }
    }

    /* global variable access */

    switch (op) {
    case OP_scope_make_ref:
        if (label_done == -1 && can_opt_put_global_ref_value(bc_buf, ls->pos)) {
            pos_next = optimize_scope_make_global_ref(ctx, s, bc, bc_buf, ls,
                                                      pos_next, var_name);
        } else {
            dbuf_putc(bc, OP_make_var_ref);
            dbuf_put_u32(bc, JS_DupAtom(ctx, var_name));
        }
        break;
    case OP_scope_get_ref:
        /* XXX: should create a dummy object with a named slot that is
           a reference to the global variable */
        dbuf_putc(bc, OP_undefined);
        dbuf_putc(bc, OP_get_var);
        dbuf_put_u32(bc, JS_DupAtom(ctx, var_name));
        break;
    case OP_scope_get_var_undef:
    case OP_scope_get_var:
    case OP_scope_put_var:
        dbuf_putc(bc, OP_get_var_undef + (op - OP_scope_get_var_undef));
        dbuf_put_u32(bc, JS_DupAtom(ctx, var_name));
        break;
    case OP_scope_put_var_init:
        dbuf_putc(bc, OP_put_var_init);
        dbuf_put_u32(bc, JS_DupAtom(ctx, var_name));
        break;
    case OP_scope_delete_var:
        dbuf_putc(bc, OP_delete_var);
        dbuf_put_u32(bc, JS_DupAtom(ctx, var_name));
        break;
    }
done:
    if (label_done >= 0) {
        dbuf_putc(bc, OP_label);
        dbuf_put_u32(bc, label_done);
        s->label_slots[label_done].pos2 = bc->size;
    }
    return pos_next;
}